

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_dns_parse.c
# Opt level: O1

ares_status_t ares_dns_parse(uchar *buf,size_t buf_len,uint flags,ares_dns_record_t **dnsrec)

{
  ares_dns_record_t *paVar1;
  uint flags_00;
  ares_status_t aVar2;
  ares_status_t aVar3;
  ares_bool_t aVar4;
  ares_buf_t *buf_00;
  size_t sVar5;
  ushort uVar6;
  unsigned_short nscount;
  unsigned_short ancount;
  unsigned_short u16_1;
  unsigned_short qdcount;
  unsigned_short u16;
  unsigned_short local_5a;
  unsigned_short local_58;
  unsigned_short local_56;
  unsigned_short local_54;
  unsigned_short local_52;
  ares_dns_record_t **local_50;
  char *local_48;
  ares_dns_rec_type_t local_40;
  uint local_3c;
  ares_buf_t *local_38;
  
  if (dnsrec == (ares_dns_record_t **)0x0 || (buf_len == 0 || buf == (uchar *)0x0)) {
    return ARES_EFORMERR;
  }
  buf_00 = ares_buf_create_const(buf,buf_len);
  if (buf_00 == (ares_buf_t *)0x0) {
    return ARES_ENOMEM;
  }
  sVar5 = ares_buf_len(buf_00);
  aVar3 = ARES_EFORMERR;
  if (0xffff < sVar5) goto LAB_00121728;
  *dnsrec = (ares_dns_record_t *)0x0;
  aVar2 = ares_buf_fetch_be16(buf_00,&local_54);
  local_50 = dnsrec;
  local_3c = flags;
  if ((aVar2 == ARES_SUCCESS) &&
     (aVar2 = ares_buf_fetch_be16(buf_00,(unsigned_short *)&local_48), aVar2 == ARES_SUCCESS)) {
    uVar6 = (ushort)local_48;
    aVar2 = ares_buf_fetch_be16(buf_00,&local_52);
    if ((aVar2 != ARES_SUCCESS) ||
       ((((aVar2 = ares_buf_fetch_be16(buf_00,&local_56), aVar2 != ARES_SUCCESS ||
          (aVar2 = ares_buf_fetch_be16(buf_00,&local_58), aVar2 != ARES_SUCCESS)) ||
         (aVar2 = ares_buf_fetch_be16(buf_00,&local_5a), aVar2 != ARES_SUCCESS)) ||
        (aVar2 = ares_dns_record_create
                           (dnsrec,local_54,
                            uVar6 * 4 & 0x40 |
                            uVar6 & 0x20 | uVar6 >> 0xf | uVar6 >> 9 & 2 | uVar6 >> 7 & 4 |
                            uVar6 >> 5 & 8 | uVar6 >> 3 & 0x10,uVar6 >> 0xb & 0xf,ARES_RCODE_NOERROR
                           ), aVar2 != ARES_SUCCESS)))) goto LAB_00121578;
    paVar1 = *dnsrec;
    paVar1->raw_rcode = uVar6 & 0xf;
    if ((((ulong)local_56 != 0) &&
        (aVar2 = ares_dns_record_rr_prealloc(paVar1,ARES_SECTION_ANSWER,(ulong)local_56),
        aVar2 != ARES_SUCCESS)) ||
       (((ulong)local_58 != 0 &&
        (aVar2 = ares_dns_record_rr_prealloc(*dnsrec,ARES_SECTION_AUTHORITY,(ulong)local_58),
        aVar2 != ARES_SUCCESS)))) goto LAB_00121578;
    dnsrec = local_50;
    aVar3 = ARES_SUCCESS;
    if (((ulong)local_5a != 0) &&
       (aVar2 = ares_dns_record_rr_prealloc(*local_50,ARES_SECTION_ADDITIONAL,(ulong)local_5a),
       aVar2 != ARES_SUCCESS)) goto LAB_00121578;
  }
  else {
LAB_00121578:
    ares_dns_record_destroy(*dnsrec);
    *dnsrec = (ares_dns_record_t *)0x0;
    local_52 = 0;
    local_56 = 0;
    local_58 = 0;
    local_5a = 0;
    aVar3 = aVar2;
  }
  if ((aVar3 == ARES_SUCCESS) && (aVar3 = ARES_EBADRESP, local_52 == 1)) {
    uVar6 = 0;
    local_38 = buf_00;
    do {
      paVar1 = *dnsrec;
      local_48 = (char *)0x0;
      aVar3 = ares_dns_name_parse(buf_00,&local_48,ARES_FALSE);
      if ((aVar3 == ARES_SUCCESS) &&
         (aVar3 = ares_buf_fetch_be16(buf_00,&local_54), dnsrec = local_50, aVar3 == ARES_SUCCESS))
      {
        local_40 = (ares_dns_rec_type_t)local_54;
        aVar3 = ares_buf_fetch_be16(buf_00,&local_54);
        dnsrec = local_50;
        buf_00 = local_38;
        if (aVar3 == ARES_SUCCESS) {
          aVar3 = ares_dns_record_query_add(paVar1,local_48,local_40,(uint)local_54);
          dnsrec = local_50;
          buf_00 = local_38;
        }
      }
      ares_free(local_48);
      flags_00 = local_3c;
      if (aVar3 != ARES_SUCCESS) goto LAB_00121719;
      uVar6 = uVar6 + 1;
    } while (uVar6 < local_52);
    if (local_56 != 0) {
      uVar6 = 0;
      do {
        aVar3 = ares_dns_parse_rr(buf_00,flags_00,ARES_SECTION_ANSWER,*dnsrec);
        if (aVar3 != ARES_SUCCESS) goto LAB_00121719;
        uVar6 = uVar6 + 1;
      } while (uVar6 < local_56);
    }
    if (local_58 != 0) {
      uVar6 = 0;
      do {
        aVar3 = ares_dns_parse_rr(buf_00,flags_00,ARES_SECTION_AUTHORITY,*dnsrec);
        if (aVar3 != ARES_SUCCESS) goto LAB_00121719;
        uVar6 = uVar6 + 1;
      } while (uVar6 < local_58);
    }
    if (local_5a != 0) {
      uVar6 = 0;
      do {
        aVar3 = ares_dns_parse_rr(buf_00,flags_00,ARES_SECTION_ADDITIONAL,*dnsrec);
        if (aVar3 != ARES_SUCCESS) goto LAB_00121719;
        uVar6 = uVar6 + 1;
      } while (uVar6 < local_5a);
    }
    aVar4 = ares_dns_rcode_isvalid((uint)(*dnsrec)->raw_rcode);
    paVar1 = *dnsrec;
    if (aVar4 == ARES_FALSE) {
      paVar1->rcode = ARES_RCODE_SERVFAIL;
    }
    else {
      paVar1->rcode = (uint)paVar1->raw_rcode;
    }
    aVar3 = ARES_SUCCESS;
  }
  else {
LAB_00121719:
    ares_dns_record_destroy(*dnsrec);
    *dnsrec = (ares_dns_record_t *)0x0;
  }
LAB_00121728:
  ares_buf_destroy(buf_00);
  return aVar3;
}

Assistant:

ares_status_t ares_dns_parse(const unsigned char *buf, size_t buf_len,
                             unsigned int flags, ares_dns_record_t **dnsrec)
{
  ares_buf_t   *parser = NULL;
  ares_status_t status;

  if (buf == NULL || buf_len == 0 || dnsrec == NULL) {
    return ARES_EFORMERR;
  }

  parser = ares_buf_create_const(buf, buf_len);
  if (parser == NULL) {
    return ARES_ENOMEM;
  }

  status = ares_dns_parse_buf(parser, flags, dnsrec);
  ares_buf_destroy(parser);

  return status;
}